

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepTiledInputFile.cpp
# Opt level: O0

void __thiscall
Imf_2_5::DeepTiledInputFile::DeepTiledInputFile(DeepTiledInputFile *this,InputPartData *part)

{
  _func_int **pp_Var1;
  GenericInputFile *in_RDI;
  int in_stack_0000002c;
  Data *in_stack_00000030;
  InputPartData *in_stack_00000198;
  DeepTiledInputFile *in_stack_000001a0;
  
  GenericInputFile::GenericInputFile(in_RDI);
  in_RDI->_vptr_GenericInputFile = (_func_int **)&PTR__DeepTiledInputFile_00441a90;
  pp_Var1 = (_func_int **)operator_new(0x1e8);
  Data::Data(in_stack_00000030,in_stack_0000002c);
  in_RDI[1]._vptr_GenericInputFile = pp_Var1;
  *(undefined1 *)(in_RDI[1]._vptr_GenericInputFile + 0x3c) = 0;
  multiPartInitialize(in_stack_000001a0,in_stack_00000198);
  return;
}

Assistant:

DeepTiledInputFile::DeepTiledInputFile (InputPartData* part) :
    _data (new Data (part->numThreads))
{
    _data->_deleteStream=false;
    try
    {
       multiPartInitialize(part);
    }
    catch(...)
    {
        delete _data;
        throw;
    }
}